

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::VirtualNgon::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          VirtualNgon *this,Vector3d *position)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  Index size;
  ulong uVar3;
  pointer puVar4;
  ulong uVar5;
  bool bVar6;
  Scalar SVar7;
  double dVar8;
  undefined1 auVar9 [16];
  VectorXd _pv;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  scalar_sum_op<double,_double> local_109;
  DenseStorage<double,__1,__1,_1,_0> local_108;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_f8;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f0;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_d8;
  Vector3d local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>_>
  local_b0;
  
  puVar4 = (this->_regions).
           super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->_regions).
           super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = puVar4 == puVar1;
  local_f8 = __return_storage_ptr__;
  if (!bVar6) {
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[2];
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[0];
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
           .array[1];
    RegionHandler::handleRemap
              (&local_f0,
               (puVar4->_M_t).
               super___uniq_ptr_impl<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>.
               _M_t.
               super__Tuple_impl<0UL,_ear::RegionHandler_*,_std::default_delete<ear::RegionHandler>_>
               .super__Head_base<0UL,_ear::RegionHandler_*,_false>._M_head_impl,&local_c8,
               (int)(this->_centreDownmix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               + 1);
    if (local_f0.super_type.m_initialized == false) {
      do {
        puVar4 = puVar4 + 1;
        bVar6 = puVar4 == puVar1;
        if (bVar6) goto LAB_0013546f;
        local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
        local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
        local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
        RegionHandler::handleRemap
                  (&local_f0,
                   (puVar4->_M_t).
                   super___uniq_ptr_impl<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ear::RegionHandler_*,_std::default_delete<ear::RegionHandler>_>
                   .super__Head_base<0UL,_ear::RegionHandler_*,_false>._M_head_impl,&local_c8,
                   (int)(this->_centreDownmix).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows + 1);
      } while (local_f0.super_type.m_initialized != true);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_108,(DenseStorage<double,__1,__1,_1,_0> *)&local_f0.super_type.m_storage);
    if (local_108.m_rows < 1 && local_108.m_data != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                   );
    }
    if (local_108.m_rows < 1) {
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                    ,0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    local_b0.m_rhs.m_lhs = &this->_centreDownmix;
    local_b0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
    m_value = local_108.m_rows - 1;
    local_b0.m_rhs.m_rhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
         local_108.m_data + (local_108.m_rows - 1);
    local_b0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
         local_108.m_data;
    local_b0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_startRow.
    m_value = 0;
    local_b0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride
         = local_108.m_rows;
    local_b0.m_rhs.m_rhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
    m_value = 1;
    local_b0.m_rhs.m_rhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride
         = local_108.m_rows;
    local_b0.m_lhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
         (XprTypeNested)&local_108;
    local_b0.m_rhs.m_rhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
         (XprTypeNested)&local_108;
    local_b0.m_rhs.m_rhs.
    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_startRow.
    m_value = local_b0.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
              m_rows.m_value;
    if ((double *)
        local_b0.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
        m_value !=
        (double *)
        (this->_centreDownmix).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                    ,0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, const Eigen::Product<Eigen::Matrix<double, -1, 1>, Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Rhs = const Eigen::Product<Eigen::Matrix<double, -1, 1>, Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>]"
                   );
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,0>const>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_108,&local_b0,
               (assign_op<double,_double> *)&local_d8,(type)0x0);
    local_d8.m_xpr = (XprTypeNested)&local_108;
    if (local_108.m_rows == 0) {
      SVar7 = 0.0;
    }
    else {
      if (local_108.m_rows < 1) {
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                      ,0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      local_b0.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
      m_value = (long)local_108.m_data;
      SVar7 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)&local_b0,&local_109,&local_d8);
    }
    if (local_108.m_rows < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SVar7;
    auVar9 = sqrtpd(auVar9,auVar9);
    uVar3 = local_108.m_rows & 0x7ffffffffffffffe;
    dVar8 = auVar9._0_8_;
    if (1 < local_108.m_rows) {
      uVar5 = 0;
      do {
        auVar2._8_8_ = dVar8;
        auVar2._0_8_ = dVar8;
        auVar9 = divpd(*(undefined1 (*) [16])(local_108.m_data + uVar5),auVar2);
        *(undefined1 (*) [16])(local_108.m_data + uVar5) = auVar9;
        uVar5 = uVar5 + 2;
      } while (uVar5 < uVar3);
    }
    if ((long)uVar3 < local_108.m_rows) {
      do {
        local_108.m_data[uVar3] = local_108.m_data[uVar3] / dVar8;
        uVar3 = uVar3 + 1;
      } while (local_108.m_rows != uVar3);
    }
    (local_f8->super_type).m_initialized = false;
    *(double **)&(local_f8->super_type).m_storage.dummy_ = local_108.m_data;
    *(Index *)((long)&(local_f8->super_type).m_storage.dummy_ + 8) = local_108.m_rows;
    local_108.m_data = (double *)0x0;
    local_108.m_rows = 0;
    (local_f8->super_type).m_initialized = true;
    if (local_f0.super_type.m_initialized == true) {
      free((void *)local_f0.super_type.m_storage.dummy_.aligner_);
    }
    if (!bVar6) {
      return local_f8;
    }
  }
LAB_0013546f:
  (local_f8->super_type).m_initialized = false;
  return local_f8;
}

Assistant:

boost::optional<Eigen::VectorXd> VirtualNgon::handle(
      Eigen::Vector3d position) const {
    for (const auto& region : _regions) {
      boost::optional<Eigen::VectorXd> pv = region->handleRemap(
          position, static_cast<int>(_centreDownmix.size() + 1));
      if (pv) {
        // downmix the last channel containing the virtual centre
        // speaker into the real speakers, and renormalise
        Eigen::VectorXd _pv = pv.get();
        _pv = _pv.head(_pv.size() - 1) + _centreDownmix * _pv.tail(1);
        _pv /= _pv.norm();
        return _pv;
      }
    }
    return boost::none;
  }